

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkheader.cpp
# Opt level: O0

QByteArray * __thiscall
QHttpNetworkHeaderPrivate::headerField
          (QHttpNetworkHeaderPrivate *this,QByteArrayView name,QByteArray *defaultValue)

{
  long lVar1;
  QByteArrayView name_00;
  bool bVar2;
  QListSpecialMethods<QByteArray> *in_RSI;
  QHttpNetworkHeaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QList<QByteArray> allValues;
  QByteArray *in_stack_ffffffffffffff78;
  QHttpNetworkHeaderPrivate *data;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QByteArrayView in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  name_00.m_data = (storage_type *)in_RDI;
  name_00.m_size = (qsizetype)in_RSI;
  data = in_RDI;
  headerFieldValues(in_RDI,name_00);
  bVar2 = QList<QByteArray>::isEmpty((QList<QByteArray> *)0x30384d);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    QByteArrayView::QByteArrayView<3ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char (*) [3])data);
    QListSpecialMethods<QByteArray>::join(in_RSI,in_stack_ffffffffffffffb0);
  }
  QList<QByteArray>::~QList((QList<QByteArray> *)0x3038a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)data;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpNetworkHeaderPrivate::headerField(QByteArrayView name, const QByteArray &defaultValue) const
{
    QList<QByteArray> allValues = headerFieldValues(name);
    if (allValues.isEmpty())
        return defaultValue;
    else
        return allValues.join(", ");
}